

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInvert.cpp
# Opt level: O0

void testInvert(void)

{
  ostream *poVar1;
  M33f m5_1;
  M33f m4_1;
  M33f m3_1;
  M33f m2_1;
  M33f m1_1;
  M44f m5;
  M44f m4;
  M44f m3;
  M44f m2;
  M44f m1;
  Matrix33<float> local_1f4;
  Matrix33<float> local_1d0;
  float in_stack_fffffffffffffe5c;
  M33f *in_stack_fffffffffffffe60;
  Matrix33<float> local_188;
  Matrix33<float> local_164;
  float in_stack_fffffffffffffecc;
  M44f *in_stack_fffffffffffffed0;
  Matrix44<float> local_100;
  Matrix44<float> local_c0;
  Matrix44<float> local_80;
  Matrix44<float> local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Testing 4x4 and 3x3 matrix inversion:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"M44f");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Matrix44<float>::Matrix44
            (&local_40,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  Imath_3_2::Matrix44<float>::Matrix44
            (&local_80,0.0,1.0,0.0,0.0,-1.0,0.0,0.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,0.0,1.0);
  Imath_3_2::Matrix44<float>::Matrix44
            (&local_c0,1.0,0.0,0.0,0.0,0.0,2.0,0.0,0.0,0.0,0.0,0.0,-1.0,0.0,0.0,1.0,0.0);
  Imath_3_2::Matrix44<float>::Matrix44
            (&local_100,0.4683281,-0.8749647,0.1229049,0.0,0.01251189,0.1456563,0.9892561,0.0,
             -0.883466,-0.4617587,0.07916244,0.0,-4.726541,3.044795,-6.737138,1.0);
  Imath_3_2::Matrix44<float>::Matrix44
            ((Matrix44<float> *)&stack0xfffffffffffffec0,0.4683281,-0.8749647,0.1229049,1.0,
             0.01251189,0.1456563,0.9892561,2.0,-0.883466,-0.4617587,0.07916244,3.0,-4.726541,
             3.044795,-6.737138,4.0);
  anon_unknown.dwarf_61130::invertM44f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  anon_unknown.dwarf_61130::invertM44f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  anon_unknown.dwarf_61130::invertM44f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  anon_unknown.dwarf_61130::invertM44f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  anon_unknown.dwarf_61130::invertM44f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
  poVar1 = std::operator<<((ostream *)&std::cout,"M33f");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Matrix33<float>::Matrix33(&local_164,1.0,0.0,0.0,0.0,1.0,0.0,0.0,0.0,1.0);
  Imath_3_2::Matrix33<float>::Matrix33(&local_188,0.0,1.0,0.0,-1.0,0.0,0.0,0.0,0.0,1.0);
  Imath_3_2::Matrix33<float>::Matrix33
            ((Matrix33<float> *)&stack0xfffffffffffffe54,2.0,0.0,0.0,0.0,0.0,-1.0,0.0,1.0,0.0);
  Imath_3_2::Matrix33<float>::Matrix33
            (&local_1d0,0.4683281,-0.8749647,0.0,0.01251189,0.1456563,0.0,0.0,0.0,1.0);
  Imath_3_2::Matrix33<float>::Matrix33
            (&local_1f4,0.4683281,-0.8749647,0.1229049,0.01251189,0.1456563,0.9892561,-0.883466,
             -0.4617587,0.07916244);
  anon_unknown.dwarf_61130::invertM33f(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  anon_unknown.dwarf_61130::invertM33f(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  anon_unknown.dwarf_61130::invertM33f(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  anon_unknown.dwarf_61130::invertM33f(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  anon_unknown.dwarf_61130::invertM33f(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
testInvert ()
{
    cout << "Testing 4x4 and 3x3 matrix inversion:" << endl;

    {
        cout << "M44f" << endl;

        // clang-format off

	M44f m1 ( 1,  0,  0,  0,
		  0,  1,  0,  0,
		  0,  0,  1,  0,
		  0,  0,  0,  1);

	M44f m2 ( 0,  1,  0,  0,
		 -1,  0,  0,  0,
		  0,  0,  1,  0,
		  0,  0,  0,  1);

	M44f m3 ( 1,  0,  0,  0,
		  0,  2,  0,  0,
		  0,  0,  0, -1,
		  0,  0,  1,  0);

	M44f m4 ( 4.683281e-01f, -8.749647e-01f,  1.229049e-01f,  0.000000e+00f,
		  1.251189e-02f,  1.456563e-01f,  9.892561e-01f,  0.000000e+00f,
		 -8.834660e-01f, -4.617587e-01f,  7.916244e-02f,  0.000000e+00f,
		 -4.726541e+00f,  3.044795e+00f, -6.737138e+00f,  1.000000e+00f);

	M44f m5 ( 4.683281e-01f, -8.749647e-01f,  1.229049e-01f,  1.000000e+00f,
		  1.251189e-02f,  1.456563e-01f,  9.892561e-01f,  2.000000e+00f,
		 -8.834660e-01f, -4.617587e-01f,  7.916244e-02f,  3.000000e+00f,
		 -4.726541e+00f,  3.044795e+00f, -6.737138e+00f,  4.000000e+00f);

        // clang-format on

        invertM44f (m1, 0);
        invertM44f (m2, 0);
        invertM44f (m3, 0);
        invertM44f (m4, 1e-6f);
        invertM44f (m5, 1e-6f);
    }

    {
        cout << "M33f" << endl;

        // clang-format off

	M33f m1 ( 1,  0,  0,
		  0,  1,  0,
		  0,  0,  1);

	M33f m2 ( 0,  1,  0,
		 -1,  0,  0,
		  0,  0,  1);

	M33f m3 ( 2,  0,  0,
		  0,  0, -1,
		  0,  1,  0);

	M33f m4 ( 4.683281e-01f, -8.749647e-01f,  0.000000e+00f,
		  1.251189e-02f,  1.456563e-01f,  0.000000e+00f,
		  0.000000e+00f,  0.000000e+00f,  1.000000e+00f);

	M33f m5 ( 4.683281e-01f, -8.749647e-01f,  1.229049e-01f,
		  1.251189e-02f,  1.456563e-01f,  9.892561e-01f,
		 -8.834660e-01f, -4.617587e-01f,  7.916244e-02f);

        // clang-format on

        invertM33f (m1, 0);
        invertM33f (m2, 0);
        invertM33f (m3, 0);
        invertM33f (m4, 1e-6f);
        invertM33f (m5, 1e-6f);
    }

    cout << "ok\n" << endl;
}